

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

char * String::findLast(char *in,char *str)

{
  char *local_28;
  char *match;
  char *result;
  char *str_local;
  char *in_local;
  
  match = (char *)0x0;
  for (local_28 = strstr(in,str); local_28 != (char *)0x0; local_28 = strstr(local_28 + 1,str)) {
    match = local_28;
  }
  return match;
}

Assistant:

const char* String::findLast(const char* in, const char* str)
{
  const char* result = 0;
  const char* match = strstr(in, str);
  for(;;)
  {
    if(!match)
      return result;
    result = match;
    match = strstr(match + 1, str);
  }
}